

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O3

type * Disa::operator+(type *__return_storage_ptr__,Vector_Dense<double,_0UL> *vector0,
                      Vector_Dense<double,_0UL> *vector1)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  source_location *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  size_type *local_c8;
  size_type local_c0;
  size_type local_b8;
  undefined8 uStack_b0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined **local_28;
  
  lVar4 = (long)(vector0->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(vector0->super_vector<double,_std::allocator<double>_>).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
  if (lVar4 == (long)(vector1->super_vector<double,_std::allocator<double>_>).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(vector1->super_vector<double,_std::allocator<double>_>).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start) {
    local_f0 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_dense.hpp:324:25)>
               ::_M_invoke;
    local_f8 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_dense.hpp:324:25)>
               ::_M_manager;
    local_108._M_unused._M_object = vector0;
    local_108._8_8_ = vector1;
    Vector_Dense<double,_0UL>::Vector_Dense
              (__return_storage_ptr__,(function<double_(unsigned_long)> *)&local_108,lVar4 >> 3);
    if (local_f8 != (code *)0x0) {
      (*local_f8)(&local_108,&local_108,3);
    }
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_28 = &PTR_s__workspace_llm4binary_github_lic_001627b0;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
             (Disa *)0x0,(Log_Level)&local_28,in_RCX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_108._M_unused._0_8_,local_108._8_8_);
  std::__cxx11::to_string
            (&local_88,
             (long)(vector0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_68,"Incompatible vector sizes, ",&local_88);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_68," vs. ");
  local_e8._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p == paVar3) {
    local_e8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_e8._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string
            (&local_a8,
             (long)(vector1->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector1->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_48,&local_e8,&local_a8);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_48,".");
  local_c8 = (size_type *)(pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8 == paVar3) {
    local_b8 = paVar3->_M_allocated_capacity;
    uStack_b0 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_c8 = &local_b8;
  }
  else {
    local_b8 = paVar3->_M_allocated_capacity;
  }
  local_c0 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_c8,local_c0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_108._M_pod_data);
  exit(1);
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type constexpr operator+(
const Vector_Dense<_type, _size_0>& vector0, const Vector_Dense<_type, _size_1>& vector1) {
  ASSERT_DEBUG(vector0.size() == vector1.size(), "Incompatible vector sizes, " + std::to_string(vector0.size()) +
                                                 " vs. " + std::to_string(vector1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  return _return_vector([&](const std::size_t ii) { return vector0[ii] + vector1[ii]; }, vector0.size());
}